

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool,_int,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this)

{
  bool bVar1;
  __tuple_element_t<3UL,_tuple<ParamIterator<const_trust_token_method_st_*>,_ParamIterator<bool>,_ParamIterator<int>,_ParamIterator<bool>_>_>
  *this_00;
  IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_> *this_local;
  
  bVar1 = AtEnd(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!AtEnd()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                  ,0x361,
                  "virtual void testing::internal::CartesianProductGenerator<const trust_token_method_st *, bool, int, bool>::IteratorImpl<std::integer_sequence<unsigned long, 0, 1, 2, 3>>::Advance() [T = <const trust_token_method_st *, bool, int, bool>, I = std::integer_sequence<unsigned long, 0, 1, 2, 3>]"
                 );
  }
  this_00 = std::
            get<3ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,testing::internal::ParamIterator<int>,testing::internal::ParamIterator<bool>>
                      (&this->current_);
  ParamIterator<bool>::operator++(this_00);
  CartesianProductGenerator<trust_token_method_st_const*,bool,int,bool>::
  IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>
            ((IteratorImpl<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }